

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O3

auto_ptr<avro::InputStream> __thiscall
avro::fileInputStream(avro *this,char *filename,size_t bufferSize)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  Exception *this_00;
  int *piVar5;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  char *local_128;
  put_holder<char,_std::char_traits<char>_> local_120;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = &PTR__FileBufferCopyIn_00181500;
  iVar1 = open(filename,0);
  *(int *)(puVar2 + 1) = iVar1;
  if (-1 < iVar1) {
    puVar3 = (undefined8 *)operator_new(0x38);
    *puVar3 = &PTR__BufferCopyInInputStream_00181630;
    puVar3[1] = bufferSize;
    pvVar4 = operator_new__(bufferSize);
    puVar3[2] = pvVar4;
    puVar3[3] = puVar2;
    puVar3[4] = 0;
    puVar3[5] = pvVar4;
    puVar3[6] = 0;
    *(undefined8 **)this = puVar3;
    return (auto_ptr<avro::InputStream>)(InputStream *)this;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_108,"Cannot open file: %1%");
  piVar5 = __errno_location();
  local_128 = strerror(*piVar5);
  local_120.put_head = boost::io::detail::call_put_head<char,std::char_traits<char>,char*const>;
  local_120.put_last = boost::io::detail::call_put_last<char,std::char_traits<char>,char*const>;
  local_120.arg = &local_128;
  msg = boost::io::detail::
        feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                  (&local_108,&local_120);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

auto_ptr<InputStream> fileInputStream(const char* filename,
    size_t bufferSize)
{
    auto_ptr<BufferCopyIn> in(new FileBufferCopyIn(filename));
    return auto_ptr<InputStream>( new BufferCopyInInputStream(in, bufferSize));
}